

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymBif::gen_code_call(CTcSymBif *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  CTcCodeStream *pCVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int in_ECX;
  CTcSymBifBase *pCVar7;
  int in_EDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int in_ESI;
  CTcSymBifBase *in_RDI;
  uchar short_ops [4];
  uchar in_stack_0000008f;
  CTcGenTarg *in_stack_00000090;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  CTcGenTarg *in_stack_ffffffffffffffa0;
  
  iVar4 = CTcGenTarg::is_speculative(G_cg);
  if (iVar4 == 0) {
    pCVar7 = in_RDI;
    if (in_EDX < in_RDI->min_argc_) {
      sVar5 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d904a);
      pcVar6 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d9058);
      CTcTokenizer::log_error(0x2cf9,sVar5 & 0xffffffff,pcVar6);
    }
    else if (((in_RDI->field_0x34 & 1) == 0) && (in_RDI->max_argc_ < in_EDX)) {
      sVar5 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d9097);
      pcVar6 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d90a5);
      CTcTokenizer::log_error(0x2cfa,sVar5 & 0xffffffff,pcVar6);
    }
    if (in_ECX != 0) {
      CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
    }
    uVar3 = CTcSymBifBase::get_func_set_id(in_RDI);
    cVar2 = (char)in_EDX;
    if ((uVar3 < 4) && (uVar3 = CTcSymBifBase::get_func_idx(in_RDI), uVar3 < 0x100)) {
      CTcSymBifBase::get_func_set_id(in_RDI);
      CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar2,__buf,(size_t)pCVar7);
      pCVar1 = G_cs;
      uVar3 = CTcSymBifBase::get_func_idx(in_RDI);
      CTcDataStream::write(&pCVar1->super_CTcDataStream,(int)(char)uVar3,__buf_00,(size_t)pCVar7);
    }
    else {
      uVar3 = CTcSymBifBase::get_func_idx(in_RDI);
      if (uVar3 < 0x100) {
        CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar2,__buf_01,(size_t)pCVar7);
        pCVar1 = G_cs;
        uVar3 = CTcSymBifBase::get_func_idx(in_RDI);
        CTcDataStream::write(&pCVar1->super_CTcDataStream,(int)(char)uVar3,__buf_02,(size_t)pCVar7);
      }
      else {
        CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar2,__buf_03,(size_t)pCVar7);
        CTcSymBifBase::get_func_idx(in_RDI);
        CTcDataStream::write2((CTcDataStream *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      }
      in_stack_ffffffffffffffa0 = (CTcGenTarg *)G_cs;
      uVar3 = CTcSymBifBase::get_func_set_id(in_RDI);
      CTcDataStream::write
                ((CTcDataStream *)in_stack_ffffffffffffffa0,(int)(char)uVar3,__buf_04,(size_t)pCVar7
                );
    }
    CTcGenTarg::note_pop(G_cg,in_EDX);
    CTcGenTarg::post_call_cleanup
              (in_stack_ffffffffffffffa0,
               (CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_00000090,in_stack_0000008f);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d92a2);
    }
    return;
  }
  err_throw(0);
}

Assistant:

void CTcSymBif::gen_code_call(int discard, int argc, int varargs,
                              CTcNamedArgs *named_args)
{
    /* don't allow calling built-in functions in speculative mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);
    
    /* check for minimum and maximum arguments */
    if (argc < min_argc_)
    {
        G_tok->log_error(TCERR_TOO_FEW_FUNC_ARGS,
                         (int)get_sym_len(), get_sym());
    }
    else if (!varargs_ && argc > max_argc_)
    {
        G_tok->log_error(TCERR_TOO_MANY_FUNC_ARGS,
                         (int)get_sym_len(), get_sym());
    }

    /* write the varargs modifier if appropriate */
    if (varargs)
        G_cg->write_op(OPC_VARARGC);

    /* generate the call */
    if (get_func_set_id() < 4 && get_func_idx() < 256)
    {
        uchar short_ops[] =
            { OPC_BUILTIN_A, OPC_BUILTIN_B, OPC_BUILTIN_C, OPC_BUILTIN_D };
        
        /* 
         *   it's one of the first 256 functions in one of the first four
         *   function sets - we can generate a short instruction 
         */
        G_cg->write_op(short_ops[get_func_set_id()]);
        G_cs->write((char)argc);
        G_cs->write((char)get_func_idx());
    }
    else
    {
        /* it's not in the default set - use the longer instruction */
        if (get_func_idx() < 256)
        {
            /* low function index - write the short form */
            G_cg->write_op(OPC_BUILTIN1);
            G_cs->write((char)argc);
            G_cs->write((char)get_func_idx());
        }
        else
        {
            /* big function index - write the long form */
            G_cg->write_op(OPC_BUILTIN2);
            G_cs->write((char)argc);
            G_cs->write2(get_func_idx());
        }

        /* write the function set ID */
        G_cs->write((char)get_func_set_id());
    }

    /* the built-in functions always remove arguments */
    G_cg->note_pop(argc);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* 
     *   if they're not discarding the value, push it - the value is
     *   sitting in R0 after the call returns
     */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}